

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O1

void __thiscall amrex::FabArray<amrex::TagBox>::~FabArray(FabArray<amrex::TagBox> *this)

{
  FabArray<amrex::TagBox> *pFVar1;
  PCData<amrex::TagBox> *__ptr;
  pointer ppTVar2;
  FabFactory<amrex::TagBox> *pFVar3;
  
  (this->super_FabArrayBase)._vptr_FabArrayBase = (_func_int **)&PTR__FabArray_007509d0;
  FabArrayBase::m_FA_stats = FabArrayBase::m_FA_stats + -1;
  clear(this);
  pFVar1 = (this->os_temp)._M_t.
           super___uniq_ptr_impl<amrex::FabArray<amrex::TagBox>,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabArray<amrex::TagBox>_*,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
           .super__Head_base<0UL,_amrex::FabArray<amrex::TagBox>_*,_false>._M_head_impl;
  if (pFVar1 != (FabArray<amrex::TagBox> *)0x0) {
    (**(code **)((long)(pFVar1->super_FabArrayBase)._vptr_FabArrayBase + 8))();
  }
  (this->os_temp)._M_t.
  super___uniq_ptr_impl<amrex::FabArray<amrex::TagBox>,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabArray<amrex::TagBox>_*,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
  .super__Head_base<0UL,_amrex::FabArray<amrex::TagBox>_*,_false>._M_head_impl =
       (FabArray<amrex::TagBox> *)0x0;
  __ptr = (this->pcd)._M_t.
          super___uniq_ptr_impl<amrex::PCData<amrex::TagBox>,_std::default_delete<amrex::PCData<amrex::TagBox>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::PCData<amrex::TagBox>_*,_std::default_delete<amrex::PCData<amrex::TagBox>_>_>
          .super__Head_base<0UL,_amrex::PCData<amrex::TagBox>_*,_false>._M_head_impl;
  if (__ptr != (PCData<amrex::TagBox> *)0x0) {
    std::default_delete<amrex::PCData<amrex::TagBox>_>::operator()
              ((default_delete<amrex::PCData<amrex::TagBox>_> *)&this->pcd,__ptr);
  }
  (this->pcd)._M_t.
  super___uniq_ptr_impl<amrex::PCData<amrex::TagBox>,_std::default_delete<amrex::PCData<amrex::TagBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::PCData<amrex::TagBox>_*,_std::default_delete<amrex::PCData<amrex::TagBox>_>_>
  .super__Head_base<0UL,_amrex::PCData<amrex::TagBox>_*,_false>._M_head_impl =
       (PCData<amrex::TagBox> *)0x0;
  std::unique_ptr<amrex::FBData<amrex::TagBox>,_std::default_delete<amrex::FBData<amrex::TagBox>_>_>
  ::~unique_ptr(&this->fbd);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->m_tags).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  ppTVar2 = (this->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppTVar2 != (pointer)0x0) {
    operator_delete(ppTVar2,(long)(this->m_fabs_v).
                                  super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar2
                   );
  }
  pFVar3 = (this->m_factory)._M_t.
           super___uniq_ptr_impl<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::TagBox>_*,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
           .super__Head_base<0UL,_amrex::FabFactory<amrex::TagBox>_*,_false>._M_head_impl;
  if (pFVar3 != (FabFactory<amrex::TagBox> *)0x0) {
    (*pFVar3->_vptr_FabFactory[1])();
  }
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::TagBox>_*,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::TagBox>_*,_false>._M_head_impl =
       (FabFactory<amrex::TagBox> *)0x0;
  FabArrayBase::~FabArrayBase(&this->super_FabArrayBase);
  return;
}

Assistant:

FabArray<FAB>::~FabArray ()
{
    m_FA_stats.recordDelete();
    clear();
}